

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000164530 = 0x2e2e2e2e2e2e2e;
    uRam0000000000164537._0_1_ = '.';
    uRam0000000000164537._1_1_ = '.';
    uRam0000000000164537._2_1_ = '.';
    uRam0000000000164537._3_1_ = '.';
    uRam0000000000164537._4_1_ = '.';
    uRam0000000000164537._5_1_ = '.';
    uRam0000000000164537._6_1_ = '.';
    uRam0000000000164537._7_1_ = '.';
    DAT_00164520 = '.';
    DAT_00164520_1._0_1_ = '.';
    DAT_00164520_1._1_1_ = '.';
    DAT_00164520_1._2_1_ = '.';
    DAT_00164520_1._3_1_ = '.';
    DAT_00164520_1._4_1_ = '.';
    DAT_00164520_1._5_1_ = '.';
    DAT_00164520_1._6_1_ = '.';
    uRam0000000000164528 = 0x2e2e2e2e2e2e2e;
    DAT_0016452f = 0x2e;
    DAT_00164510 = '.';
    DAT_00164510_1._0_1_ = '.';
    DAT_00164510_1._1_1_ = '.';
    DAT_00164510_1._2_1_ = '.';
    DAT_00164510_1._3_1_ = '.';
    DAT_00164510_1._4_1_ = '.';
    DAT_00164510_1._5_1_ = '.';
    DAT_00164510_1._6_1_ = '.';
    uRam0000000000164518._0_1_ = '.';
    uRam0000000000164518._1_1_ = '.';
    uRam0000000000164518._2_1_ = '.';
    uRam0000000000164518._3_1_ = '.';
    uRam0000000000164518._4_1_ = '.';
    uRam0000000000164518._5_1_ = '.';
    uRam0000000000164518._6_1_ = '.';
    uRam0000000000164518._7_1_ = '.';
    DAT_00164500 = '.';
    DAT_00164500_1._0_1_ = '.';
    DAT_00164500_1._1_1_ = '.';
    DAT_00164500_1._2_1_ = '.';
    DAT_00164500_1._3_1_ = '.';
    DAT_00164500_1._4_1_ = '.';
    DAT_00164500_1._5_1_ = '.';
    DAT_00164500_1._6_1_ = '.';
    uRam0000000000164508._0_1_ = '.';
    uRam0000000000164508._1_1_ = '.';
    uRam0000000000164508._2_1_ = '.';
    uRam0000000000164508._3_1_ = '.';
    uRam0000000000164508._4_1_ = '.';
    uRam0000000000164508._5_1_ = '.';
    uRam0000000000164508._6_1_ = '.';
    uRam0000000000164508._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001644f8._0_1_ = '.';
    uRam00000000001644f8._1_1_ = '.';
    uRam00000000001644f8._2_1_ = '.';
    uRam00000000001644f8._3_1_ = '.';
    uRam00000000001644f8._4_1_ = '.';
    uRam00000000001644f8._5_1_ = '.';
    uRam00000000001644f8._6_1_ = '.';
    uRam00000000001644f8._7_1_ = '.';
    DAT_0016453f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }